

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O3

cmServerResponse * __thiscall
cmServerProtocol1::ProcessFileSystemWatchers
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  cmServer *this_00;
  cmFileMonitor *this_01;
  Value *pVVar1;
  ValueHolder value;
  pointer value_00;
  Value directories;
  Value result;
  Value files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  ValueHolder local_120;
  string *local_118;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  this_00 = (this->super_cmServerProtocol).m_Server;
  if (this_00 == (cmServer *)0x0) {
    this_01 = (cmFileMonitor *)0x0;
  }
  else {
    this_01 = cmServer::FileMonitor(this_00);
  }
  Json::Value::Value(&local_d0,objectValue);
  Json::Value::Value(&local_a8,arrayValue);
  cmFileMonitor::WatchedFiles_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_120,this_01);
  if (local_120 != local_118) {
    value = local_120;
    do {
      Json::Value::Value(&local_f8,(string *)value.map_);
      Json::Value::append(&local_a8,&local_f8);
      Json::Value::~Value(&local_f8);
      value.string_ = (char *)&((value.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right
      ;
    } while ((string *)value.int_ != local_118);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_120);
  Json::Value::Value(&local_f8,arrayValue);
  cmFileMonitor::WatchedDirectories_abi_cxx11_(&local_138,this_01);
  if (local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    value_00 = local_138.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      Json::Value::Value((Value *)&local_120,value_00);
      Json::Value::append(&local_f8,(Value *)&local_120);
      Json::Value::~Value((Value *)&local_120);
      value_00 = value_00 + 1;
    } while (value_00 !=
             local_138.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  Json::Value::Value(&local_58,&local_a8);
  pVVar1 = Json::Value::operator[](&local_d0,&kWATCHED_FILES_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_58);
  Json::Value::~Value(&local_58);
  Json::Value::Value(&local_80,&local_f8);
  pVVar1 = Json::Value::operator[](&local_d0,&kWATCHED_DIRECTORIES_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_80);
  Json::Value::~Value(&local_80);
  cmServerRequest::Reply(__return_storage_ptr__,request,&local_d0);
  Json::Value::~Value(&local_f8);
  Json::Value::~Value(&local_a8);
  Json::Value::~Value(&local_d0);
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessFileSystemWatchers(
  const cmServerRequest& request)
{
  const cmFileMonitor* const fm = FileMonitor();
  Json::Value result = Json::objectValue;
  Json::Value files = Json::arrayValue;
  for (const auto& f : fm->WatchedFiles()) {
    files.append(f);
  }
  Json::Value directories = Json::arrayValue;
  for (const auto& d : fm->WatchedDirectories()) {
    directories.append(d);
  }
  result[kWATCHED_FILES_KEY] = files;
  result[kWATCHED_DIRECTORIES_KEY] = directories;

  return request.Reply(result);
}